

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.cpp
# Opt level: O3

vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
* mocker::nasm::getUsedRegs
            (vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
             *__return_storage_ptr__,shared_ptr<mocker::nasm::Inst> *inst)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  pointer psVar2;
  int iVar3;
  shared_ptr<mocker::nasm::Register> *psVar4;
  long lVar5;
  long lVar6;
  bool bVar7;
  initializer_list<std::shared_ptr<mocker::nasm::Register>_> __l;
  initializer_list<std::shared_ptr<mocker::nasm::Register>_> __l_00;
  initializer_list<std::shared_ptr<mocker::nasm::Register>_> __l_01;
  initializer_list<std::shared_ptr<mocker::nasm::Register>_> __l_02;
  initializer_list<std::shared_ptr<mocker::nasm::Register>_> __l_03;
  initializer_list<std::shared_ptr<mocker::nasm::Register>_> __l_04;
  shared_ptr<mocker::nasm::Call> p;
  shared_ptr<mocker::nasm::BinaryInst> p_4;
  shared_ptr<mocker::nasm::Lea> p_2;
  shared_ptr<mocker::nasm::Mov> p_1;
  vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  local_f8;
  vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  local_e0;
  vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  local_c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b0;
  element_type *local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a0;
  element_type *local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_90;
  element_type *local_88;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  element_type *local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_70;
  long local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  shared_ptr<mocker::nasm::Addr> local_50;
  long local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  dyc<mocker::nasm::Empty,std::shared_ptr<mocker::nasm::Inst>const&>((nasm *)&local_c8,inst);
  bVar7 = true;
  if ((element_type *)
      local_c8.
      super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
      ._M_impl.super__Vector_impl_data._M_start == (element_type *)0x0) {
    dyc<mocker::nasm::Pop,std::shared_ptr<mocker::nasm::Inst>const&>((nasm *)&local_f8,inst);
    bVar7 = true;
    if ((element_type *)
        local_f8.
        super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
        ._M_impl.super__Vector_impl_data._M_start == (element_type *)0x0) {
      dyc<mocker::nasm::Jmp,std::shared_ptr<mocker::nasm::Inst>const&>((nasm *)&local_e0,inst);
      bVar7 = true;
      if (local_e0.
          super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
          ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
        dyc<mocker::nasm::Cqo,std::shared_ptr<mocker::nasm::Inst>const&>((nasm *)&local_60,inst);
        bVar7 = true;
        if (local_60 == 0) {
          dyc<mocker::nasm::CJump,std::shared_ptr<mocker::nasm::Inst>const&>((nasm *)&local_50,inst)
          ;
          bVar7 = true;
          if (local_50.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            dyc<mocker::nasm::Set,std::shared_ptr<mocker::nasm::Inst>const&>((nasm *)&local_40,inst)
            ;
            bVar7 = local_40 != 0;
            if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
            }
          }
          if (local_50.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_50.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
        }
        if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
        }
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_e0.
          super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_e0.
                   super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
      }
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_f8.
        super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_f8.
                 super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_c8.
      super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_c8.
               super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (bVar7) {
    (__return_storage_ptr__->
    super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    dyc<mocker::nasm::Call,std::shared_ptr<mocker::nasm::Inst>const&>((nasm *)&local_f8,inst);
    psVar2 = local_f8.
             super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((element_type *)
        local_f8.
        super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (element_type *)0x0) {
      if (rdi()::res == '\0') {
        iVar3 = __cxa_guard_acquire(&rdi()::res);
        if (iVar3 != 0) {
          rdi::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[4]>
                    (&rdi::res.
                      super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,(Register **)&rdi::res,
                     (allocator<mocker::nasm::Register> *)&local_e0,(char (*) [4])"rdi");
          __cxa_atexit(std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                       ~__shared_ptr,&rdi::res,&__dso_handle);
          __cxa_guard_release(&rdi()::res);
        }
      }
      local_c8.
      super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)rdi::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr;
      local_c8.
      super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)rdi::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
      if (rdi::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (rdi::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (rdi::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (rdi::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (rdi::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      if (rsi()::res == '\0') {
        iVar3 = __cxa_guard_acquire(&rsi()::res);
        if (iVar3 != 0) {
          rsi::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[4]>
                    (&rsi::res.
                      super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,(Register **)&rsi::res,
                     (allocator<mocker::nasm::Register> *)&local_e0,(char (*) [4])"rsi");
          __cxa_atexit(std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                       ~__shared_ptr,&rsi::res,&__dso_handle);
          __cxa_guard_release(&rsi()::res);
        }
      }
      local_c8.
      super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)rsi::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr;
      local_b0 = rsi::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
      if (rsi::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (rsi::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (rsi::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (rsi::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (rsi::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      if (rdx()::res == '\0') {
        iVar3 = __cxa_guard_acquire(&rdx()::res);
        if (iVar3 != 0) {
          rdx::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[4]>
                    (&rdx::res.
                      super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,(Register **)&rdx::res,
                     (allocator<mocker::nasm::Register> *)&local_e0,(char (*) [4])"rdx");
          __cxa_atexit(std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                       ~__shared_ptr,&rdx::res,&__dso_handle);
          __cxa_guard_release(&rdx()::res);
        }
      }
      local_a8 = rdx::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
      local_a0 = rdx::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
      if (rdx::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (rdx::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (rdx::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (rdx::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (rdx::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      if (rcx()::res == '\0') {
        iVar3 = __cxa_guard_acquire(&rcx()::res);
        if (iVar3 != 0) {
          rcx::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[4]>
                    (&rcx::res.
                      super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,(Register **)&rcx::res,
                     (allocator<mocker::nasm::Register> *)&local_e0,(char (*) [4])"rcx");
          __cxa_atexit(std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                       ~__shared_ptr,&rcx::res,&__dso_handle);
          __cxa_guard_release(&rcx()::res);
        }
      }
      local_98 = rcx::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
      local_90 = rcx::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
      if (rcx::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (rcx::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (rcx::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (rcx::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (rcx::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      if (r8()::res == '\0') {
        iVar3 = __cxa_guard_acquire(&r8()::res);
        if (iVar3 != 0) {
          r8::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[3]>
                    (&r8::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount,(Register **)&r8::res,
                     (allocator<mocker::nasm::Register> *)&local_e0,(char (*) [3])"r8");
          __cxa_atexit(std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                       ~__shared_ptr,&r8::res,&__dso_handle);
          __cxa_guard_release(&r8()::res);
        }
      }
      local_88 = r8::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
      local_80 = r8::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
      if (r8::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (r8::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (r8::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (r8::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (r8::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      if (r9()::res == '\0') {
        iVar3 = __cxa_guard_acquire(&r9()::res);
        if (iVar3 != 0) {
          r9::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<mocker::nasm::Register,std::allocator<mocker::nasm::Register>,char_const(&)[3]>
                    (&r9::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount,(Register **)&r9::res,
                     (allocator<mocker::nasm::Register> *)&local_e0,(char (*) [3])"r9");
          __cxa_atexit(std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::
                       ~__shared_ptr,&r9::res,&__dso_handle);
          __cxa_guard_release(&r9()::res);
        }
      }
      local_78 = r9::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
      local_70 = r9::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
      if (r9::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (r9::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (r9::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (r9::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (r9::res.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      __l._M_len = 6;
      __l._M_array = (iterator)&local_c8;
      std::
      vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
      ::vector(__return_storage_ptr__,__l,(allocator_type *)&local_e0);
      lVar6 = 0x60;
      do {
        p_Var1 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                  ((long)&local_e0.
                          super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar6);
        if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
        }
        lVar6 = lVar6 + -0x10;
      } while (lVar6 != 0);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_f8.
        super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_f8.
                 super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
    }
    if ((element_type *)psVar2 == (element_type *)0x0) {
      dyc<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Inst>const&>((nasm *)&local_60,inst);
      lVar6 = local_60;
      if (local_60 != 0) {
        local_c8.
        super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
        ._M_impl.super__Vector_impl_data._M_start = *(pointer *)(local_60 + 0x18);
        local_c8.
        super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = *(pointer *)(local_60 + 0x20);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            local_c8.
            super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            local_c8.
            super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
            ._M_impl.super__Vector_impl_data._M_finish)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_c8.
                 super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            local_c8.
            super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
            ._M_impl.super__Vector_impl_data._M_finish)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_c8.
                 super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->_M_use_count + 1;
          }
        }
        getInvolvedRegs(__return_storage_ptr__,(shared_ptr<mocker::nasm::Addr> *)&local_c8);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            local_c8.
            super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_c8.
                     super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
        }
        local_f8.
        super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
        ._M_impl.super__Vector_impl_data._M_start = *(pointer *)(local_60 + 8);
        local_f8.
        super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = *(pointer *)(local_60 + 0x10);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            local_f8.
            super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            local_f8.
            super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
            ._M_impl.super__Vector_impl_data._M_finish)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_f8.
                 super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            local_f8.
            super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
            ._M_impl.super__Vector_impl_data._M_finish)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_f8.
                 super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->_M_use_count + 1;
          }
        }
        dyc<mocker::nasm::Register,std::shared_ptr<mocker::nasm::Addr>const>
                  ((nasm *)&local_c8,(shared_ptr<mocker::nasm::Addr> *)&local_f8);
        psVar2 = local_c8.
                 super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            local_c8.
            super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_c8.
                     super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            local_f8.
            super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_f8.
                     super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
        }
        if ((element_type *)psVar2 == (element_type *)0x0) {
          local_50.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               *(element_type **)(local_60 + 8);
          local_50.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_60 + 0x10);
          if (local_50.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_50.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_50.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_50.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_50.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          getInvolvedRegs(&local_e0,&local_50);
          anon_unknown_52::merge(&local_f8,__return_storage_ptr__,&local_e0);
          local_c8.
          super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (__return_storage_ptr__->
               super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
               )._M_impl.super__Vector_impl_data._M_end_of_storage;
          (__return_storage_ptr__->
          super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage =
               local_f8.
               super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_c8.
          super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (__return_storage_ptr__->
               super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
          local_c8.
          super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               (__return_storage_ptr__->
               super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
          (__return_storage_ptr__->
          super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
          )._M_impl.super__Vector_impl_data._M_start =
               local_f8.
               super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          (__return_storage_ptr__->
          super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
          )._M_impl.super__Vector_impl_data._M_finish =
               local_f8.
               super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          local_f8.
          super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_f8.
          super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_f8.
          super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::
          vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
          ::~vector(&local_c8);
          std::
          vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
          ::~vector(&local_f8);
          std::
          vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
          ::~vector(&local_e0);
          if (local_50.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_50.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
        }
      }
      if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
      }
      if (lVar6 == 0) {
        dyc<mocker::nasm::Lea,std::shared_ptr<mocker::nasm::Inst>const&>((nasm *)&local_c8,inst);
        psVar2 = local_c8.
                 super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((element_type *)
            local_c8.
            super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (element_type *)0x0) {
          getInvolvedRegs(__return_storage_ptr__,
                          (shared_ptr<mocker::nasm::Addr> *)
                          &((string *)
                           ((long)local_c8.
                                  super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 8))->field_2);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            local_c8.
            super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_c8.
                     super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
        }
        if ((element_type *)psVar2 == (element_type *)0x0) {
          dyc<mocker::nasm::UnaryInst,std::shared_ptr<mocker::nasm::Inst>const&>
                    ((nasm *)&local_c8,inst);
          psVar2 = local_c8.
                   super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if ((element_type *)
              local_c8.
              super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
              ._M_impl.super__Vector_impl_data._M_start != (element_type *)0x0) {
            local_f8.
            super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 (pointer)((string *)
                          ((long)local_c8.
                                 super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + 8))->_M_string_length;
            local_f8.
            super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 (pointer)(((string *)
                           ((long)local_c8.
                                  super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 8))->field_2).
                          _M_allocated_capacity;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_f8.
                super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_f8.
                super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                ._M_impl.super__Vector_impl_data._M_finish)->_M_use_count =
                     ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_f8.
                     super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_f8.
                super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                ._M_impl.super__Vector_impl_data._M_finish)->_M_use_count =
                     ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_f8.
                     super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish)->_M_use_count + 1;
              }
            }
            __l_00._M_len = 1;
            __l_00._M_array = (iterator)&local_f8;
            std::
            vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
            ::vector(__return_storage_ptr__,__l_00,(allocator_type *)&local_e0);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_f8.
                super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         local_f8.
                         super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
            }
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_c8.
              super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_c8.
                       super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
          }
          if ((element_type *)psVar2 == (element_type *)0x0) {
            dyc<mocker::nasm::BinaryInst,std::shared_ptr<mocker::nasm::Inst>const&>
                      ((nasm *)&local_e0,inst);
            psVar2 = local_e0.
                     super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if (local_e0.
                super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              getInvolvedRegs(&local_c8,
                              (shared_ptr<mocker::nasm::Addr> *)
                              (local_e0.
                               super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + 1));
              getInvolvedRegs(&local_f8,
                              (shared_ptr<mocker::nasm::Addr> *)
                              (local_e0.
                               super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + 2));
              anon_unknown_52::merge(__return_storage_ptr__,&local_c8,&local_f8);
              std::
              vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
              ::~vector(&local_f8);
              std::
              vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
              ::~vector(&local_c8);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_e0.
                super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         local_e0.
                         super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
            }
            if (psVar2 == (pointer)0x0) {
              dyc<mocker::nasm::Push,std::shared_ptr<mocker::nasm::Inst>const&>
                        ((nasm *)&local_c8,inst);
              psVar2 = local_c8.
                       super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              if ((element_type *)
                  local_c8.
                  super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                  ._M_impl.super__Vector_impl_data._M_start != (element_type *)0x0) {
                local_f8.
                super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                ._M_impl.super__Vector_impl_data._M_start =
                     (pointer)(((string *)
                               ((long)local_c8.
                                      super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + 8))->_M_dataplus).
                              _M_p;
                local_f8.
                super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                ._M_impl.super__Vector_impl_data._M_finish =
                     (pointer)((string *)
                              ((long)local_c8.
                                     super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + 8))->
                              _M_string_length;
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    local_f8.
                    super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    local_f8.
                    super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish)->_M_use_count =
                         ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         local_f8.
                         super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish)->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    local_f8.
                    super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish)->_M_use_count =
                         ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         local_f8.
                         super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish)->_M_use_count + 1;
                  }
                }
                __l_01._M_len = 1;
                __l_01._M_array = (iterator)&local_f8;
                std::
                vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                ::vector(__return_storage_ptr__,__l_01,(allocator_type *)&local_e0);
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    local_f8.
                    super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             local_f8.
                             super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish);
                }
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  local_c8.
                  super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_c8.
                           super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
              }
              if ((element_type *)psVar2 == (element_type *)0x0) {
                dyc<mocker::nasm::Leave,std::shared_ptr<mocker::nasm::Inst>const&>
                          ((nasm *)&local_c8,inst);
                psVar2 = local_c8.
                         super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                if ((element_type *)
                    local_c8.
                    super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                    ._M_impl.super__Vector_impl_data._M_start != (element_type *)0x0) {
                  psVar4 = rbp();
                  local_f8.
                  super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                  ._M_impl.super__Vector_impl_data._M_start =
                       (pointer)(psVar4->
                                super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                )._M_ptr;
                  local_f8.
                  super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish =
                       (pointer)(psVar4->
                                super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                )._M_refcount._M_pi;
                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      local_f8.
                      super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish !=
                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    if (__libc_single_threaded == '\0') {
                      LOCK();
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      local_f8.
                      super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish)->_M_use_count =
                           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_f8.
                           super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish)->_M_use_count + 1;
                      UNLOCK();
                    }
                    else {
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      local_f8.
                      super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish)->_M_use_count =
                           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           local_f8.
                           super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish)->_M_use_count + 1;
                    }
                  }
                  __l_02._M_len = 1;
                  __l_02._M_array = (iterator)&local_f8;
                  std::
                  vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                  ::vector(__return_storage_ptr__,__l_02,(allocator_type *)&local_e0);
                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      local_f8.
                      super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish !=
                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                               local_f8.
                               super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish);
                  }
                }
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    local_c8.
                    super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             local_c8.
                             super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish);
                }
                if ((element_type *)psVar2 == (element_type *)0x0) {
                  dyc<mocker::nasm::Cmp,std::shared_ptr<mocker::nasm::Inst>const&>
                            ((nasm *)&local_e0,inst);
                  psVar2 = local_e0.
                           super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  if (local_e0.
                      super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                    getInvolvedRegs(&local_c8,
                                    (shared_ptr<mocker::nasm::Addr> *)
                                    &((local_e0.
                                       super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->
                                     super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                     )._M_refcount);
                    getInvolvedRegs(&local_f8,
                                    (shared_ptr<mocker::nasm::Addr> *)
                                    &local_e0.
                                     super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[1].
                                     super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount);
                    anon_unknown_52::merge(__return_storage_ptr__,&local_c8,&local_f8);
                    std::
                    vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                    ::~vector(&local_f8);
                    std::
                    vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                    ::~vector(&local_c8);
                  }
                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      local_e0.
                      super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish !=
                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                               local_e0.
                               super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish);
                  }
                  if (psVar2 == (pointer)0x0) {
                    dyc<mocker::nasm::IDiv,std::shared_ptr<mocker::nasm::Inst>const&>
                              ((nasm *)&local_60,inst);
                    lVar6 = local_60;
                    if (local_60 != 0) {
                      psVar4 = rax();
                      local_c8.
                      super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                      ._M_impl.super__Vector_impl_data._M_start =
                           (pointer)(psVar4->
                                    super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                    )._M_ptr;
                      local_c8.
                      super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish =
                           (pointer)(psVar4->
                                    super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                    )._M_refcount._M_pi;
                      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                          local_c8.
                          super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish !=
                          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                        if (__libc_single_threaded == '\0') {
                          LOCK();
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                          local_c8.
                          super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish)->_M_use_count =
                               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                               local_c8.
                               super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish)->_M_use_count + 1;
                          UNLOCK();
                        }
                        else {
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                          local_c8.
                          super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish)->_M_use_count =
                               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                               local_c8.
                               super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish)->_M_use_count + 1;
                        }
                      }
                      psVar4 = rdx();
                      local_c8.
                      super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage =
                           (pointer)(psVar4->
                                    super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                    )._M_ptr;
                      local_b0 = (psVar4->
                                 super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                 )._M_refcount._M_pi;
                      if (local_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                        if (__libc_single_threaded == '\0') {
                          LOCK();
                          local_b0->_M_use_count = local_b0->_M_use_count + 1;
                          UNLOCK();
                        }
                        else {
                          local_b0->_M_use_count = local_b0->_M_use_count + 1;
                        }
                      }
                      __l_03._M_len = 2;
                      __l_03._M_array = (iterator)&local_c8;
                      std::
                      vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                      ::vector(&local_f8,__l_03,(allocator_type *)&local_50);
                      getInvolvedRegs(&local_e0,(shared_ptr<mocker::nasm::Addr> *)(local_60 + 8));
                      anon_unknown_52::merge(__return_storage_ptr__,&local_f8,&local_e0);
                      std::
                      vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                      ::~vector(&local_e0);
                      std::
                      vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                      ::~vector(&local_f8);
                      lVar5 = 0x20;
                      do {
                        p_Var1 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                                  ((long)&local_e0.
                                          super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar5
                                  );
                        if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
                        }
                        lVar5 = lVar5 + -0x10;
                      } while (lVar5 != 0);
                    }
                    if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
                    }
                    if (lVar6 == 0) {
                      dyc<mocker::nasm::Ret,std::shared_ptr<mocker::nasm::Inst>const&>
                                ((nasm *)&local_f8,inst);
                      psVar2 = local_f8.
                               super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                      if ((element_type *)
                          local_f8.
                          super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                          ._M_impl.super__Vector_impl_data._M_start != (element_type *)0x0) {
                        psVar4 = rbp();
                        local_c8.
                        super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                        ._M_impl.super__Vector_impl_data._M_start =
                             (pointer)(psVar4->
                                      super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                      )._M_ptr;
                        local_c8.
                        super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish =
                             (pointer)(psVar4->
                                      super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                      )._M_refcount._M_pi;
                        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                            local_c8.
                            super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish !=
                            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                          if (__libc_single_threaded == '\0') {
                            LOCK();
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                            local_c8.
                            super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish)->_M_use_count =
                                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                 local_c8.
                                 super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish)->_M_use_count + 1;
                            UNLOCK();
                          }
                          else {
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                            local_c8.
                            super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish)->_M_use_count =
                                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                 local_c8.
                                 super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish)->_M_use_count + 1;
                          }
                        }
                        psVar4 = rbx();
                        local_c8.
                        super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage =
                             (pointer)(psVar4->
                                      super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                      )._M_ptr;
                        local_b0 = (psVar4->
                                   super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_refcount._M_pi;
                        if (local_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                          if (__libc_single_threaded == '\0') {
                            LOCK();
                            local_b0->_M_use_count = local_b0->_M_use_count + 1;
                            UNLOCK();
                          }
                          else {
                            local_b0->_M_use_count = local_b0->_M_use_count + 1;
                          }
                        }
                        psVar4 = r12();
                        local_a8 = (psVar4->
                                   super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_ptr;
                        local_a0 = (psVar4->
                                   super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_refcount._M_pi;
                        if (local_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                          if (__libc_single_threaded == '\0') {
                            LOCK();
                            local_a0->_M_use_count = local_a0->_M_use_count + 1;
                            UNLOCK();
                          }
                          else {
                            local_a0->_M_use_count = local_a0->_M_use_count + 1;
                          }
                        }
                        psVar4 = r13();
                        local_98 = (psVar4->
                                   super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_ptr;
                        local_90 = (psVar4->
                                   super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_refcount._M_pi;
                        if (local_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                          if (__libc_single_threaded == '\0') {
                            LOCK();
                            local_90->_M_use_count = local_90->_M_use_count + 1;
                            UNLOCK();
                          }
                          else {
                            local_90->_M_use_count = local_90->_M_use_count + 1;
                          }
                        }
                        psVar4 = r14();
                        local_88 = (psVar4->
                                   super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_ptr;
                        local_80 = (psVar4->
                                   super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_refcount._M_pi;
                        if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                          if (__libc_single_threaded == '\0') {
                            LOCK();
                            local_80->_M_use_count = local_80->_M_use_count + 1;
                            UNLOCK();
                          }
                          else {
                            local_80->_M_use_count = local_80->_M_use_count + 1;
                          }
                        }
                        psVar4 = r15();
                        local_78 = (psVar4->
                                   super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_ptr;
                        local_70 = (psVar4->
                                   super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_refcount._M_pi;
                        if (local_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                          if (__libc_single_threaded == '\0') {
                            LOCK();
                            local_70->_M_use_count = local_70->_M_use_count + 1;
                            UNLOCK();
                          }
                          else {
                            local_70->_M_use_count = local_70->_M_use_count + 1;
                          }
                        }
                        __l_04._M_len = 6;
                        __l_04._M_array = (iterator)&local_c8;
                        std::
                        vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                        ::vector(__return_storage_ptr__,__l_04,(allocator_type *)&local_e0);
                        lVar6 = 0x60;
                        do {
                          p_Var1 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                                    ((long)&local_e0.
                                            super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage +
                                    lVar6);
                          if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
                          }
                          lVar6 = lVar6 + -0x10;
                        } while (lVar6 != 0);
                      }
                      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                          local_f8.
                          super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish !=
                          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                   local_f8.
                                   super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish);
                      }
                      if ((element_type *)psVar2 == (element_type *)0x0) {
                        __assert_fail("false",
                                      "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/nasm/src/helper.cpp"
                                      ,0x5a,
                                      "std::vector<std::shared_ptr<Register>> mocker::nasm::getUsedRegs(const std::shared_ptr<Inst> &)"
                                     );
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::shared_ptr<Register>>
getUsedRegs(const std::shared_ptr<Inst> &inst) {
  if (dyc<Empty>(inst) || dyc<Pop>(inst) || dyc<Jmp>(inst) || dyc<Cqo>(inst) ||
      dyc<CJump>(inst) || dyc<Set>(inst))
    return {};

  if (auto p = dyc<Call>(inst)) {
    return {rdi(), rsi(), rdx(), rcx(), r8(), r9()};
  }

  if (auto p = dyc<Mov>(inst)) {
    auto res = getInvolvedRegs(p->getOperand());
    if (!dyc<Register>(p->getDest()))
      res = merge(res, getInvolvedRegs(p->getDest()));
    return res;
  }

  if (auto p = dyc<Lea>(inst)) {
    return getInvolvedRegs(p->getAddr());
  }
  if (auto p = dyc<UnaryInst>(inst)) {
    return {p->getReg()};
  }
  if (auto p = dyc<BinaryInst>(inst)) {
    return merge(getInvolvedRegs(p->getLhs()), getInvolvedRegs(p->getRhs()));
  }
  if (auto p = dyc<Push>(inst)) {
    return {p->getReg()};
  }
  if (auto p = dyc<Leave>(inst)) {
    return {rbp()};
  }
  if (auto p = dyc<Cmp>(inst)) {
    return merge(getInvolvedRegs(p->getLhs()), getInvolvedRegs(p->getRhs()));
  }
  if (auto p = dyc<IDiv>(inst)) {
    return merge({rax(), rdx()}, getInvolvedRegs(p->getRhs()));
  }
  if (auto p = dyc<Ret>(inst)) {
    return {rbp(), rbx(), r12(), r13(), r14(), r15()};
  }
  assert(false);
}